

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall
AddrManImpl::AddSingle(AddrManImpl *this,CAddress *addr,CNetAddr *source,seconds time_penalty)

{
  ServiceFlags *pSVar1;
  FastRandomContext *this_00;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int bucket;
  uint32_t uVar5;
  AddrInfo *this_01;
  time_point tVar6;
  long lVar7;
  uint64_t uVar8;
  long lVar9;
  Logger *this_02;
  rep rVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int (*args_2) [64];
  mapped_type *in_stack_ffffffffffffff70;
  uint32_t mapped_as;
  int nUBucketPos;
  int nUBucket;
  int nId;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CNetAddr::IsRoutable((CNetAddr *)addr);
  if (!bVar3) goto LAB_00448aa8;
  this_01 = Find(this,&addr->super_CService,&nId);
  bVar3 = ::operator==((CNetAddr *)addr,source);
  if (bVar3) {
    time_penalty.__r = 0;
  }
  if (this_01 == (AddrInfo *)0x0) {
    this_01 = Create(this,addr,source,&nId);
    lVar9 = (this_01->super_CAddress).nTime.__d.__r - time_penalty.__r;
    rVar10 = 0;
    if (0 < lVar9) {
      rVar10 = lVar9;
    }
    (this_01->super_CAddress).nTime.__d.__r = rVar10;
  }
  else {
    tVar6 = NodeClock::now();
    lVar9 = (addr->nTime).__d.__r;
    lVar11 = lVar9 - time_penalty.__r;
    lVar13 = lVar11 + -0x15180;
    if (lVar9 * -1000000000 + (long)tVar6.__d.__r < 86400000000000) {
      lVar13 = lVar11 + -0xe10;
    }
    lVar7 = (this_01->super_CAddress).nTime.__d.__r;
    if (lVar7 < lVar13) {
      lVar7 = 0;
      if (0 < lVar11) {
        lVar7 = lVar11;
      }
      (this_01->super_CAddress).nTime.__d.__r = lVar7;
      lVar9 = (addr->nTime).__d.__r;
    }
    pSVar1 = &(this_01->super_CAddress).nServices;
    *pSVar1 = *pSVar1 | addr->nServices;
    if (((lVar9 <= lVar7) || (this_01->fInTried != false)) ||
       (iVar2 = this_01->nRefCount, iVar2 == 8)) goto LAB_00448aa8;
    if (0 < iVar2) {
      uVar14 = ~(-1 << ((byte)iVar2 & 0x1f));
      uVar4 = 0x20;
      if (uVar14 != 0) {
        uVar4 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      this_00 = &this->insecure_rand;
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar4);
      } while (uVar14 < uVar8);
      if (uVar8 != 0) goto LAB_00448aa8;
    }
  }
  bucket = AddrInfo::GetNewBucket(this_01,&this->nKey,source,this->m_netgroupman);
  nUBucket = bucket;
  uVar4 = AddrInfo::GetBucketPosition(this_01,&this->nKey,true,bucket);
  lVar9 = (ulong)(uint)(bucket << 8) + 0x10178;
  uVar12 = (ulong)uVar4;
  iVar2 = *(int *)((long)this->vvNew[0] + uVar12 * 4 + lVar9 + -0x10178);
  bVar3 = iVar2 == -1;
  nUBucketPos = uVar4;
  if (iVar2 == nId) goto LAB_00448aaa;
  if (iVar2 != -1) {
    in_stack_ffffffffffffff70 =
         std::__detail::
         _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->mapInfo,
                      (key_type *)((long)this->vvNew[0] + uVar12 * 4 + lVar9 + -0x10178));
    tVar6 = NodeClock::now();
    bVar3 = AddrInfo::IsTerrible
                      (in_stack_ffffffffffffff70,(NodeSeconds)((long)tVar6.__d.__r / 1000000000));
    if (!bVar3) {
      if (in_stack_ffffffffffffff70->nRefCount < 2) {
        if (this_01->nRefCount == 0) {
          Delete(this,nId);
        }
      }
      else if (this_01->nRefCount == 0) goto LAB_004489ec;
LAB_00448aa8:
      bVar3 = false;
      goto LAB_00448aaa;
    }
  }
LAB_004489ec:
  args_2 = this->vvNew;
  ClearNew(this,bucket,uVar4);
  this_01->nRefCount = this_01->nRefCount + 1;
  *(int *)((long)*args_2 + uVar12 * 4 + (ulong)(uint)(bucket << 8)) = nId;
  uVar5 = NetGroupManager::GetMappedAS(this->m_netgroupman,(CNetAddr *)addr);
  mapped_as = uVar5;
  this_02 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(this_02,ADDRMAN,Debug);
  if (bVar3) {
    CService::ToStringAddrPort_abi_cxx11_(&local_58,&addr->super_CService);
    if (uVar5 == 0) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    }
    else {
      tinyformat::format<unsigned_int>(&local_78," mapped to AS%i",&mapped_as);
    }
    logging_function._M_str = "AddSingle";
    logging_function._M_len = 9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
    source_file._M_len = 0x54;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string,int,int>
              (logging_function,source_file,0x268,
               IPC|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|CMPCTBLOCK|SELECTCOINS|WALLETDB|ZMQ|HTTP|
               MEMPOOL,(Level)&local_58,(char *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nUBucket,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nUBucketPos,
               *args_2,(int *)in_stack_ffffffffffffff70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = true;
LAB_00448aaa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool AddrManImpl::AddSingle(const CAddress& addr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    AssertLockHeld(cs);

    if (!addr.IsRoutable())
        return false;

    int nId;
    AddrInfo* pinfo = Find(addr, &nId);

    // Do not set a penalty for a source's self-announcement
    if (addr == source) {
        time_penalty = 0s;
    }

    if (pinfo) {
        // periodically update nTime
        const bool currently_online{NodeClock::now() - addr.nTime < 24h};
        const auto update_interval{currently_online ? 1h : 24h};
        if (pinfo->nTime < addr.nTime - update_interval - time_penalty) {
            pinfo->nTime = std::max(NodeSeconds{0s}, addr.nTime - time_penalty);
        }

        // add services
        pinfo->nServices = ServiceFlags(pinfo->nServices | addr.nServices);

        // do not update if no new information is present
        if (addr.nTime <= pinfo->nTime) {
            return false;
        }

        // do not update if the entry was already in the "tried" table
        if (pinfo->fInTried)
            return false;

        // do not update if the max reference count is reached
        if (pinfo->nRefCount == ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
            return false;

        // stochastic test: previous nRefCount == N: 2^N times harder to increase it
        if (pinfo->nRefCount > 0) {
            const int nFactor{1 << pinfo->nRefCount};
            if (insecure_rand.randrange(nFactor) != 0) return false;
        }
    } else {
        pinfo = Create(addr, source, &nId);
        pinfo->nTime = std::max(NodeSeconds{0s}, pinfo->nTime - time_penalty);
    }

    int nUBucket = pinfo->GetNewBucket(nKey, source, m_netgroupman);
    int nUBucketPos = pinfo->GetBucketPosition(nKey, true, nUBucket);
    bool fInsert = vvNew[nUBucket][nUBucketPos] == -1;
    if (vvNew[nUBucket][nUBucketPos] != nId) {
        if (!fInsert) {
            AddrInfo& infoExisting = mapInfo[vvNew[nUBucket][nUBucketPos]];
            if (infoExisting.IsTerrible() || (infoExisting.nRefCount > 1 && pinfo->nRefCount == 0)) {
                // Overwrite the existing new table entry.
                fInsert = true;
            }
        }
        if (fInsert) {
            ClearNew(nUBucket, nUBucketPos);
            pinfo->nRefCount++;
            vvNew[nUBucket][nUBucketPos] = nId;
            const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
            LogDebug(BCLog::ADDRMAN, "Added %s%s to new[%i][%i]\n",
                     addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), nUBucket, nUBucketPos);
        } else {
            if (pinfo->nRefCount == 0) {
                Delete(nId);
            }
        }
    }
    return fInsert;
}